

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int m_select_code_option(aec_stream *strm)

{
  int iVar1;
  uint uVar2;
  internal_state *state_00;
  internal_state *piVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  byte *dst;
  size_t i;
  ulong uVar14;
  uint64_t fs;
  ulong uVar15;
  ulong uVar16;
  size_t i_1;
  ulong uVar17;
  internal_state *state;
  bool bVar18;
  
  state_00 = strm->state;
  iVar10 = state_00->id_len;
  uVar17 = (ulong)strm->block_size;
  if (iVar10 < 2) {
    uVar11 = 0xffffffff;
  }
  else {
    iVar12 = strm->block_size - state_00->ref;
    iVar1 = state_00->k;
    bVar18 = false;
    iVar6 = iVar1;
    bVar7 = iVar1 == 0;
    uVar13 = 0xffffffffffffffff;
    iVar9 = iVar1;
    do {
      do {
        while( true ) {
          while( true ) {
            bVar5 = bVar7;
            iVar8 = iVar6;
            uVar15 = 0;
            for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
              uVar15 = uVar15 + (state_00->block[uVar14] >> ((byte)iVar8 & 0x1f));
            }
            uVar14 = (long)((iVar8 + 1) * iVar12) + uVar15;
            if (uVar14 < uVar13) break;
            bVar18 = true;
            iVar6 = iVar1 + -1;
            bVar7 = true;
            if (bVar5) goto LAB_001a047d;
          }
          if (uVar13 != 0xffffffffffffffff) {
            bVar5 = true;
          }
          uVar13 = uVar14;
          iVar9 = iVar8;
          bVar7 = bVar5;
          if (!bVar18) break;
          if ((iVar8 == 0) || (bVar18 = true, iVar6 = iVar8 + -1, (ulong)(long)iVar12 <= uVar15))
          goto LAB_001a047d;
        }
      } while (((ulong)(long)iVar12 <= uVar15) &&
              (bVar18 = false, iVar6 = iVar8 + 1, iVar8 < state_00->kmax));
      bVar18 = true;
      iVar6 = iVar1 + -1;
      bVar7 = true;
    } while (!bVar5);
LAB_001a047d:
    uVar11 = (uint)uVar13;
    state_00->k = iVar9;
  }
  uVar2 = state_00->uncomp_len;
  uVar13 = 1;
  uVar14 = 0;
  do {
    uVar15 = uVar14;
    if (uVar17 <= uVar15) break;
    uVar14 = (ulong)state_00->block[uVar15];
    uVar16 = (ulong)state_00->block[uVar15 + 1];
    uVar13 = uVar13 + uVar16 + ((uVar14 + uVar16 + 1) * (uVar16 + uVar14) >> 1) + 1;
    uVar14 = uVar15 + 2;
  } while (uVar13 <= uVar2);
  uVar4 = (uint)uVar13;
  if (uVar15 < uVar17) {
    uVar4 = 0xffffffff;
  }
  if (uVar11 < uVar2) {
    if (uVar4 <= uVar11) {
LAB_001a051e:
      m_encode_se(strm);
      return 1;
    }
    iVar1 = state_00->k;
    emit(state_00,iVar1 + 1,iVar10);
    if (state_00->ref == 0) {
      uVar17 = 0;
    }
    else {
      emit(state_00,state_00->ref_sample,strm->bits_per_sample);
      uVar17 = (ulong)state_00->ref;
    }
    piVar3 = strm->state;
    dst = piVar3->cds;
    uVar13 = (ulong)*dst << 0x38;
    uVar11 = 7 - piVar3->bits;
    for (; uVar17 < strm->block_size; uVar17 = uVar17 + 1) {
      for (iVar10 = (piVar3->block[uVar17] >> ((byte)iVar1 & 0x1f)) + uVar11 + -0x3e;
          uVar11 = iVar10 + 0x3f, 0x3f < uVar11; iVar10 = iVar10 + -0x40) {
        copy64(dst,uVar13);
        dst = piVar3->cds + 8;
        piVar3->cds = dst;
        uVar13 = 0;
      }
      uVar13 = uVar13 | 1L << ((ulong)(byte)-(char)iVar10 & 0x3f);
    }
    copy64(dst,uVar13);
    piVar3->cds = piVar3->cds + (uVar11 >> 3);
    piVar3->bits = ~uVar11 & 7;
    if (iVar1 != 0) {
      emitblock(strm,iVar1,state_00->ref);
    }
  }
  else {
    if (uVar4 < uVar2) goto LAB_001a051e;
    emit(state_00,~(-1 << ((byte)iVar10 & 0x1f)),iVar10);
    if (state_00->ref != 0) {
      *state_00->block = state_00->ref_sample;
    }
    emitblock(strm,strm->bits_per_sample,0);
  }
  m_flush_block(strm);
  return 1;
}

Assistant:

static int m_select_code_option(struct aec_stream *strm)
{
    /**
       Decide which code option to use.
    */

    struct internal_state *state = strm->state;

    uint32_t split_len;
    if (state->id_len > 1)
        split_len = assess_splitting_option(strm);
    else
        split_len = UINT32_MAX;
    uint32_t se_len = assess_se_option(strm);

    if (split_len < state->uncomp_len) {
        if (split_len < se_len)
            return m_encode_splitting(strm);
        else
            return m_encode_se(strm);
    } else {
        if (state->uncomp_len <= se_len)
            return m_encode_uncomp(strm);
        else
            return m_encode_se(strm);
    }
}